

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O1

void __thiscall FIX::FileStore::reset(FileStore *this)

{
  int __oflag;
  int local_28;
  int64_t local_20;
  
  (this->m_cache).m_nextSenderMsgSeqNum = 1;
  (this->m_cache).m_nextTargetMsgSeqNum = 1;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->m_cache).m_messages._M_t);
  DateTime::nowUtc();
  (this->m_cache).m_creationTime.super_DateTime.m_date = local_28;
  (this->m_cache).m_creationTime.super_DateTime.m_time = local_20;
  open(this,(char *)0x1,__oflag);
  setSession(this);
  return;
}

Assistant:

void FileStore::reset() EXCEPT ( IOException )
{
  try
  {
    m_cache.reset();
    open( true );
    setSession();
  }
  catch( std::exception& e )
  {
    throw IOException( e.what() );
  }
}